

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  long *plVar1;
  iterator iVar2;
  int local_14;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_003557df;
    *iVar2._M_current = 5;
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_003557df:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
      goto LAB_003557ec;
    }
    *iVar2._M_current = 4;
  }
  (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = iVar2._M_current + 1;
LAB_003557ec:
  plVar1 = (long *)(*(long *)(this + 0x18) + 0x40);
  if (*(long *)(this + 0x18) == 0) {
    plVar1 = (long *)(*(long *)(this + 0x10) + 0x60);
  }
  iVar2._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = (int)((ulong)((long)this - *plVar1) >> 3) * 0x38e38e39;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}